

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::clearBufferuiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,deUint32 *value)

{
  bool bVar1;
  int x;
  int z;
  byte bVar2;
  int y;
  int z_00;
  int s;
  int y_00;
  byte bVar3;
  IVec4 area;
  MultisamplePixelBufferAccess access;
  MultisamplePixelBufferAccess colorBuf;
  Vector<unsigned_int,_4> local_e8;
  BVec4 *local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  Vector<int,_4> local_b8;
  MultisampleConstPixelBufferAccess local_a0;
  Vector<unsigned_int,_4> local_78;
  MultisamplePixelBufferAccess local_68;
  
  if (buffer != 0x1800) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (drawbuffer != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (this->m_scissorEnabled == true) {
    tcu::Vector<int,_4>::Vector(&local_b8,&this->m_scissorBox);
  }
  else {
    local_b8.m_data[0] = 0;
    local_b8.m_data[1] = 0;
    local_b8.m_data[2] = 0x7fffffff;
    local_b8.m_data[3] = 0x7fffffff;
  }
  getDrawColorbuffer(&local_68,this);
  bVar1 = (this->m_colorMask).m_data[1];
  if ((this->m_colorMask).m_data[0] == true) {
    bVar2 = 1;
    if ((bVar1 != false) && ((this->m_colorMask).m_data[2] == true)) {
      bVar2 = (this->m_colorMask).m_data[3] ^ 1;
    }
  }
  else {
    bVar2 = 1;
    if ((bVar1 == false) && ((this->m_colorMask).m_data[2] == false)) {
      bVar3 = (this->m_colorMask).m_data[3] ^ 1;
      goto LAB_0048a58e;
    }
  }
  bVar3 = 0;
LAB_0048a58e:
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_a0,&local_68);
  local_e8.m_data[0] = 0;
  local_e8.m_data[1] = 0;
  intersect(&local_b8,(IVec4 *)&local_e8);
  if (((local_c0 != 0) && (local_bc != 0)) && (bVar3 == 0)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_a0,&local_68,local_c8,local_c4,local_c0,
                     local_bc);
    local_e8.m_data._0_8_ = *(undefined8 *)value;
    local_e8.m_data._8_8_ = *(undefined8 *)(value + 2);
    if (bVar2 == 0) {
      tcu::Vector<unsigned_int,_4>::cast<int>(&local_78);
      rr::clear((MultisamplePixelBufferAccess *)&local_a0,(IVec4 *)&local_78);
    }
    else {
      local_d0 = &this->m_colorMask;
      for (z_00 = 0; z_00 < local_a0.m_access.m_size.m_data[2]; z_00 = z_00 + 1) {
        for (z = 0; z < local_a0.m_access.m_size.m_data[1]; z = z + 1) {
          for (y_00 = 0; y_00 < local_a0.m_access.m_size.m_data[0]; y_00 = y_00 + 1) {
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_a0,y_00,z);
            tcu::select<unsigned_int,4>
                      ((tcu *)&local_78,&local_e8,
                       (Vector<unsigned_int,_4> *)&stack0xffffffffffffffc0,local_d0);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&local_a0,(UVec4 *)&local_78,y_00,z,z_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferuiv (deUint32 buffer, int drawbuffer, const deUint32* value)
{
	RC_IF_ERROR(buffer != GL_COLOR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	TCU_CHECK_INTERNAL(buffer == GL_COLOR);
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			tcu::UVec4							color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color.asInt());
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelUint(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
}